

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::SEES_PDU::Decode(SEES_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  allocator<char> local_59;
  PropulsionSystem ps;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x1b < iVar2 + (uint)KVar1) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_OriginatingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
      [3])(&this->m_OriginatingEntity,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16IrSigRepIndex);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16AcousticSigRepIndex);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16CrossSection);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumPropulsionSys);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumVectoringNozzleSys);
    std::
    vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>::
    clear(&this->m_vPropSys);
    std::
    vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
    ::clear(&this->m_vVecNozzleSys);
    for (uVar3 = 0; uVar3 < this->m_ui16NumPropulsionSys; uVar3 = uVar3 + 1) {
      DATA_TYPE::PropulsionSystem::PropulsionSystem(&ps);
      (*ps.super_DataTypeBase._vptr_DataTypeBase[3])(&ps,stream);
      std::
      vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
      ::push_back(&this->m_vPropSys,&ps);
      DATA_TYPE::PropulsionSystem::~PropulsionSystem(&ps);
    }
    for (uVar3 = 0; uVar3 < this->m_ui16NumVectoringNozzleSys; uVar3 = uVar3 + 1) {
      DATA_TYPE::VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)&ps);
      (*ps.super_DataTypeBase._vptr_DataTypeBase[3])((VectoringNozzleSystem *)&ps,stream);
      std::
      vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
      ::push_back(&this->m_vVecNozzleSys,(VectoringNozzleSystem *)&ps);
      DATA_TYPE::VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&ps);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ps,"Decode",&local_59);
  KException::KException(this_00,(KString *)&ps,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SEES_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SEES_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_OriginatingEntity
           >> m_ui16IrSigRepIndex
           >> m_ui16AcousticSigRepIndex
           >> m_ui16CrossSection
           >> m_ui16NumPropulsionSys
           >> m_ui16NumVectoringNozzleSys;

    m_vPropSys.clear();
    m_vVecNozzleSys.clear();

    for( KUINT16 i = 0; i < m_ui16NumPropulsionSys; ++i )
    {
        PropulsionSystem ps;
        stream >> KDIS_STREAM ps;
        m_vPropSys.push_back( ps );
    }

    for( KUINT16 i = 0; i < m_ui16NumVectoringNozzleSys; ++i )
    {
        VectoringNozzleSystem vns;
        stream >> KDIS_STREAM vns;
        m_vVecNozzleSys.push_back( vns );
    }
}